

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::ByteSizeLong
          (BayesianProbitRegressor_Gaussian *this)

{
  bool bVar1;
  int size;
  long lVar2;
  double dVar3;
  int cached_size;
  uint64_t raw_precision;
  double tmp_precision;
  uint64_t raw_mean;
  double tmp_mean;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  BayesianProbitRegressor_Gaussian *this_local;
  
  sStack_18 = 0;
  dVar3 = _internal_mean(this);
  if (dVar3 != 0.0) {
    sStack_18 = 9;
  }
  dVar3 = _internal_precision(this);
  if (dVar3 != 0.0) {
    sStack_18 = sStack_18 + 9;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar2 = std::__cxx11::string::size();
    sStack_18 = lVar2 + sStack_18;
  }
  size = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,size);
  return sStack_18;
}

Assistant:

size_t BayesianProbitRegressor_Gaussian::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // double mean = 1;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_mean = this->_internal_mean();
  uint64_t raw_mean;
  memcpy(&raw_mean, &tmp_mean, sizeof(tmp_mean));
  if (raw_mean != 0) {
    total_size += 1 + 8;
  }

  // double precision = 2;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_precision = this->_internal_precision();
  uint64_t raw_precision;
  memcpy(&raw_precision, &tmp_precision, sizeof(tmp_precision));
  if (raw_precision != 0) {
    total_size += 1 + 8;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}